

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O2

RefArrayVectorOf<char16_t> * __thiscall
xercesc_4_0::RegularExpression::tokenize
          (RegularExpression *this,char *expression,MemoryManager *manager)

{
  XMLCh *toDelete;
  XMLSize_t end;
  RefArrayVectorOf<char16_t> *pRVar1;
  ArrayJanitor<char16_t> janBuf;
  ArrayJanitor<char16_t> AStack_28;
  
  toDelete = XMLString::transcode(expression,manager);
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_28,toDelete,manager);
  end = XMLString::stringLen(toDelete);
  pRVar1 = tokenize(this,toDelete,0,end,manager);
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_28);
  return pRVar1;
}

Assistant:

RefArrayVectorOf<XMLCh>* RegularExpression::tokenize(const char* const expression,
                                                     MemoryManager* const manager) const
{

  XMLCh* tmpBuf = XMLString::transcode(expression, manager);
  ArrayJanitor<XMLCh> janBuf(tmpBuf, manager);
  return tokenize(tmpBuf, 0, XMLString::stringLen(tmpBuf), manager);
}